

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall
ImPool<ImGuiDockContextPruneNodeData>::~ImPool(ImPool<ImGuiDockContextPruneNodeData> *this)

{
  Clear(this);
  ImVector<ImGuiStorage::ImGuiStoragePair>::~ImVector(&(this->Map).Data);
  ImVector<ImGuiDockContextPruneNodeData>::~ImVector(&this->Buf);
  return;
}

Assistant:

~ImPool()   { Clear(); }